

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

void __thiscall Fl_Input_::drawtext(Fl_Input_ *this,int X,int Y,int W,int H)

{
  char *e;
  uchar uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color FVar6;
  undefined4 extraout_var;
  char *e_00;
  long lVar7;
  size_t sVar8;
  Fl_Window *win;
  int iVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  uint uVar11;
  undefined4 in_register_00000014;
  char *pcVar12;
  int iVar13;
  Fl_Boxtype FVar14;
  undefined4 in_register_00000034;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  float x;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  undefined8 in_stack_fffffffffffffb08;
  undefined4 uVar23;
  float local_4e8;
  uint local_4cc;
  int local_4c8;
  int local_4c4;
  int offset2;
  int offset1;
  ulong local_4a0;
  ulong local_498;
  int local_48c;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  float local_46c;
  float local_468;
  float local_464;
  float local_460;
  int local_45c;
  long local_458;
  long local_450;
  ulong local_448;
  ulong local_440;
  char buf [1024];
  
  local_498 = CONCAT44(in_register_00000034,X);
  local_4a0 = (ulong)(uint)H;
  uVar1 = (this->super_Fl_Widget).damage_;
  if ((Fl_Input_ *)Fl::focus_ != this) {
    if (this->size_ == 0) {
      if ((char)uVar1 < '\0') {
        return;
      }
      FVar14 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
      iVar4 = Fl::box_dx(FVar14);
      iVar5 = (int)local_498;
      iVar3 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
      iVar9 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
      iVar16 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
      Fl_Widget::draw_box(&this->super_Fl_Widget,FVar14,iVar5 - iVar4,Y - iVar3,W + iVar9,H + iVar16
                          ,(this->super_Fl_Widget).color_);
      return;
    }
    local_4c4 = 0;
    local_4c8 = 0;
    if ((Fl_Input_ *)Fl::pushed_ != this) goto LAB_001b8605;
  }
  iVar4 = this->position_;
  local_4c8 = this->mark_;
  local_4c4 = local_4c8;
  if (local_4c8 < iVar4) {
    local_4c4 = iVar4;
  }
  if (iVar4 < local_4c8) {
    local_4c8 = iVar4;
  }
LAB_001b8605:
  setfont(this);
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar9 = iVar3 / 2;
  pcVar15 = this->value_;
  local_480 = (ulong)(uint)(W - iVar9);
  iVar16 = 0;
  local_48c = 0;
  local_478 = 0;
  iVar4 = 0;
  while( true ) {
    e_00 = expand(this,pcVar15,buf);
    lVar7 = (long)this->position_;
    pcVar12 = this->value_;
    if (((long)pcVar15 - (long)pcVar12 <= lVar7) && (lVar7 <= (long)e_00 - (long)pcVar12)) {
      dVar20 = expandpos(this,pcVar15,pcVar12 + lVar7,buf,(int *)0x0);
      uVar11 = (uint)(dVar20 + 0.5);
      local_478 = (ulong)uVar11;
      if (((Fl_Input_ *)Fl::focus_ == this) && (was_up_down == 0)) {
        up_down_pos = (double)(int)uVar11;
      }
      iVar5 = this->xscroll_;
      if ((int)local_480 + iVar5 < (int)uVar11) {
        dVar20 = expandpos(this,pcVar15,e_00,buf,(int *)0x0);
        iVar4 = (int)dVar20 + 4;
        if ((int)(iVar9 + uVar11) <= (int)dVar20 + 4) {
          iVar4 = iVar9 + uVar11;
        }
        iVar5 = this->xscroll_;
        iVar10 = iVar4 - W;
      }
      else {
        iVar10 = iVar5;
        if ((int)uVar11 < iVar5 + iVar9) {
          iVar10 = uVar11 - iVar9;
        }
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      iVar4 = iVar16;
      if (iVar10 != iVar5) {
        this->xscroll_ = iVar10;
        this->mu_p = 0;
        this->erase_cursor_only = '\0';
      }
    }
    uVar17 = local_4a0;
    if (this->value_ + this->size_ <= e_00) break;
    pcVar15 = e_00 + 1;
    local_48c = local_48c + -1;
    iVar16 = iVar16 + iVar3;
  }
  iVar9 = (int)local_4a0;
  if (((this->super_Fl_Widget).type_ & 7) == 4) {
    iVar16 = this->yscroll_;
    iVar5 = iVar16;
    if (iVar4 < iVar16) {
      iVar5 = iVar4;
    }
    iVar10 = (iVar3 - iVar9) + iVar4;
    if (iVar4 <= (iVar9 - iVar3) + iVar5) {
      iVar10 = iVar5;
    }
    iVar4 = -1;
    if (-1 < iVar10) {
      iVar4 = iVar10;
    }
    if (iVar4 != iVar16) {
      this->yscroll_ = iVar4;
      this->mu_p = 0;
      this->erase_cursor_only = '\0';
    }
  }
  else {
    this->yscroll_ = (iVar3 - iVar9) / 2;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,local_498,CONCAT44(in_register_00000014,Y),
             CONCAT44(in_register_0000000c,W));
  iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
  local_4cc = this->textcolor_;
  if (iVar4 == 0) {
    local_4cc = fl_inactive(local_4cc);
  }
  local_480 = CONCAT44(local_480._4_4_,-iVar3);
  pcVar15 = this->value_;
  iVar9 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
  iVar16 = (int)local_498;
  x = (float)((iVar16 - this->xscroll_) + 1);
  iVar4 = -this->yscroll_;
  fVar21 = (float)(W + iVar16);
  local_464 = (float)iVar16;
  local_468 = x + 2.0;
  local_46c = local_464 + -3.0;
  local_460 = (float)(iVar3 / 4);
  local_45c = iVar3 / -8 + -1;
  local_450 = (long)local_4c8;
  local_458 = (long)local_4c4;
  local_440 = (ulong)(uint)(iVar3 + -4 + Y);
  local_448 = (ulong)((Y + iVar3) - 1);
  local_488 = (ulong)(uint)((iVar3 + Y) - iVar9);
  do {
    iVar9 = (int)uVar17;
    if (iVar9 <= iVar4) {
LAB_001b8ed0:
      if ((((-1 < (char)uVar1) && (((this->super_Fl_Widget).type_ & 7) == 4)) && (iVar4 < iVar9)) &&
         ((this->erase_cursor_only == '\0' || (pcVar15 <= this->value_ + this->mu_p)))) {
        iVar3 = 0;
        if (0 < iVar4) {
          iVar3 = iVar4;
        }
        iVar4 = iVar3;
        iVar13 = (int)local_498;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                  (fl_graphics_driver,local_498 & 0xffffffff,(ulong)(uint)(iVar4 + Y),W,
                   (ulong)(uint)(iVar9 - iVar4));
        FVar14 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
        iVar3 = Fl::box_dx(FVar14);
        iVar16 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
        iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
        iVar10 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
        Fl_Widget::draw_box(&this->super_Fl_Widget,FVar14,iVar13 - iVar3,Y - iVar16,W + iVar5,
                            iVar10 + iVar9,(this->super_Fl_Widget).color_);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
      if ((Fl_Input_ *)Fl::focus_ == this) {
        iVar3 = this->textfont_;
        iVar16 = this->textsize_;
        iVar10 = (int)local_478;
        iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
        win = Fl_Widget::window(&this->super_Fl_Widget);
        fl_set_spot(iVar3,iVar16,iVar10 + (int)x,(iVar4 + Y) - iVar5,W,iVar9,win);
      }
      return;
    }
    if (local_48c != 0) {
      e_00 = expand(this,pcVar15,buf);
    }
    uVar23 = (undefined4)((ulong)in_stack_fffffffffffffb08 >> 0x20);
    if ((int)local_480 < iVar4) {
      if ((char)uVar1 < '\0') {
LAB_001b8b05:
        if (((local_4c8 < local_4c4) &&
            (pcVar12 = this->value_, local_450 <= (long)e_00 - (long)pcVar12)) &&
           ((long)pcVar15 - (long)pcVar12 < local_458)) {
          offset1 = 0;
          e = pcVar12 + local_450;
          local_4e8 = x;
          if (pcVar15 < e) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)local_4cc);
            dVar20 = expandpos(this,pcVar15,e,buf,&offset1);
            local_4e8 = (float)dVar20 + x;
            fl_draw(buf,offset1,x,(float)((int)local_488 + iVar4));
            pcVar12 = this->value_;
          }
          pcVar12 = pcVar12 + local_458;
          if (e_00 < pcVar12) {
            sVar8 = strlen(buf);
            offset2 = (int)sVar8;
            fVar19 = fVar21;
          }
          else {
            dVar20 = expandpos(this,pcVar15,pcVar12,buf,&offset2);
            fVar19 = (float)dVar20 + x;
          }
          uVar17 = local_4a0;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)(this->super_Fl_Widget).color2_);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(uint)(int)(local_4e8 + 0.5),(ulong)(uint)(Y + iVar4)
                     ,(ulong)(uint)(int)((fVar19 - local_4e8) + 0.5));
          FVar6 = fl_contrast(this->textcolor_,(this->super_Fl_Widget).color2_);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar6);
          fVar22 = (float)((int)local_488 + iVar4);
          fl_draw(buf + offset1,offset2 - offset1,local_4e8,fVar22);
          if (pcVar12 < e_00) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)local_4cc);
            pcVar12 = buf + offset2;
            sVar8 = strlen(pcVar12);
            iVar9 = (int)sVar8;
            goto LAB_001b8c2e;
          }
        }
        else {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)local_4cc);
          pcVar12 = buf;
          sVar8 = strlen(pcVar12);
          fVar22 = (float)((int)local_488 + iVar4);
          iVar9 = (int)sVar8;
          fVar19 = x;
LAB_001b8c2e:
          fl_draw(pcVar12,iVar9,fVar19,fVar22);
        }
        if (-1 < (char)uVar1) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
        }
      }
      else {
        pcVar12 = this->value_ + this->mu_p;
        if (pcVar12 <= e_00) {
          bVar2 = (this->super_Fl_Widget).type_;
          if ((bVar2 & 8) == 0) {
            bVar18 = this->erase_cursor_only != '\0';
            if ((bVar18) && (pcVar12 < pcVar15)) goto LAB_001b8c4b;
          }
          else {
            this->erase_cursor_only = '\0';
            bVar18 = false;
          }
          fVar19 = fVar21;
          if (pcVar15 < pcVar12) {
            dVar20 = expandpos(this,pcVar15,pcVar12,buf,(int *)0x0);
            fVar22 = (float)dVar20 + x;
            if (this->erase_cursor_only == '\0') {
              if (((this->super_Fl_Widget).type_ & 8) != 0) {
                fVar22 = fVar22 + -3.0;
              }
            }
            else {
              fVar19 = fVar22 + 2.0;
            }
          }
          else {
            fVar19 = local_468;
            if (!bVar18) {
              fVar19 = fVar21;
            }
            fVar22 = local_464;
            if (!bVar18 && (bVar2 & 8) != 0) {
              fVar19 = fVar21;
              fVar22 = local_46c;
            }
          }
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                    (fl_graphics_driver,(ulong)(uint)((int)fVar22 + local_45c),
                     (ulong)(uint)(Y + iVar4),
                     (ulong)(uint)(int)((fVar19 - fVar22) + 2.0 + local_460),
                     CONCAT44(extraout_var,iVar3));
          FVar14 = (Fl_Boxtype)(this->super_Fl_Widget).box_;
          iVar9 = Fl::box_dx(FVar14);
          iVar13 = (int)local_498;
          iVar16 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
          iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
          iVar10 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
          uVar17 = local_4a0;
          FVar6 = (this->super_Fl_Widget).color_;
          in_stack_fffffffffffffb08 = CONCAT44(uVar23,FVar6);
          Fl_Widget::draw_box(&this->super_Fl_Widget,FVar14,iVar13 - iVar9,Y - iVar16,iVar5 + W,
                              iVar10 + (int)local_4a0,FVar6);
          goto LAB_001b8b05;
        }
      }
LAB_001b8c4b:
      if ((local_4c8 == local_4c4) && ((Fl_Input_ *)Fl::focus_ == this)) {
        if (((long)pcVar15 - (long)this->value_ <= (long)this->position_) &&
           ((long)this->position_ <= (long)e_00 - (long)this->value_)) {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)this->cursor_color_);
          dVar20 = expandpos(this,pcVar15,this->value_ + this->position_,buf,(int *)0x0);
          local_478 = (ulong)(uint)(int)(dVar20 + 0.5);
          fVar19 = (float)(int)(dVar20 + 0.5) + x;
          if (((this->super_Fl_Widget).type_ & 8) == 0) {
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,(ulong)(uint)(int)(fVar19 + 0.5),(ulong)(uint)(Y + iVar4),
                       2);
          }
          else {
            uVar11 = (int)local_448 + iVar4;
            in_stack_fffffffffffffb08 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffb08 >> 0x20),uVar11);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
                      (fl_graphics_driver,(ulong)(uint)(int)(fVar19 + -2.5),(ulong)uVar11,
                       (ulong)(uint)(int)(fVar19 + 0.5),(ulong)(uint)((int)local_440 + iVar4),
                       (ulong)(uint)(int)(fVar19 + 3.5),in_stack_fffffffffffffb08);
          }
        }
      }
    }
    iVar9 = (int)uVar17;
    if (this->value_ + this->size_ <= e_00) {
      iVar4 = iVar4 + iVar3;
      goto LAB_001b8ed0;
    }
    iVar4 = iVar4 + iVar3;
    if ((*e_00 == ' ') || (pcVar15 = e_00, *e_00 == '\n')) {
      pcVar15 = e_00 + 1;
      e_00 = pcVar15;
    }
  } while( true );
}

Assistant:

void Fl_Input_::drawtext(int X, int Y, int W, int H) {
  int do_mu = !(damage()&FL_DAMAGE_ALL);

  if (Fl::focus()!=this && !size()) {
    if (do_mu) { // we have to erase it if cursor was there
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    }
    return;
  }

  int selstart, selend;
  if (Fl::focus()!=this && /*Fl::selection_owner()!=this &&*/ Fl::pushed()!=this)
    selstart = selend = 0;
  else if (position() <= mark()) {
    selstart = position(); selend = mark();
  } else {
    selend = position(); selstart = mark();
  }

  setfont();
  const char *p, *e;
  char buf[MAXBUF];

  // count how many lines and put the last one into the buffer:
  // And figure out where the cursor is:
  int height = fl_height();
  int threshold = height/2;
  int lines;
  int curx, cury;
  for (p=value(), curx=cury=lines=0; ;) {
    e = expand(p, buf);
    if (position() >= p-value() && position() <= e-value()) {
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (Fl::focus()==this && !was_up_down) up_down_pos = curx;
      cury = lines*height;
      int newscroll = xscroll_;
      if (curx > newscroll+W-threshold) {
	// figure out scrolling so there is space after the cursor:
	newscroll = curx+threshold-W;
	// figure out the furthest left we ever want to scroll:
	int ex = int(expandpos(p, e, buf, 0))+4-W;
	// use minimum of both amounts:
	if (ex < newscroll) newscroll = ex;
      } else if (curx < newscroll+threshold) {
	newscroll = curx-threshold;
      }
      if (newscroll < 0) newscroll = 0;
      if (newscroll != xscroll_) {
	xscroll_ = newscroll;
	mu_p = 0; erase_cursor_only = 0;
      }
    }
    lines++;
    if (e >= value_+size_) break;
    p = e+1;
  }

  // adjust the scrolling:
  if (input_type()==FL_MULTILINE_INPUT) {
    int newy = yscroll_;
    if (cury < newy) newy = cury;
    if (cury > newy+H-height) newy = cury-H+height;
    if (newy < -1) newy = -1;
    if (newy != yscroll_) {yscroll_ = newy; mu_p = 0; erase_cursor_only = 0;}
  } else {
    yscroll_ = -(H-height)/2;
  }

  fl_push_clip(X, Y, W, H);
  Fl_Color tc = active_r() ? textcolor() : fl_inactive(textcolor());

  p = value();
  // visit each line and draw it:
  int desc = height-fl_descent();
  float xpos = (float)(X - xscroll_ + 1);
  int ypos = -yscroll_;
  for (; ypos < H;) {

    // re-expand line unless it is the last one calculated above:
    if (lines>1) e = expand(p, buf);

    if (ypos <= -height) goto CONTINUE; // clipped off top

    if (do_mu) {	// for minimal update:
      const char* pp = value()+mu_p; // pointer to where minimal update starts
      if (e < pp) goto CONTINUE2; // this line is before the changes
      if (readonly()) erase_cursor_only = 0; // this isn't the most efficient way
      if (erase_cursor_only && p > pp) goto CONTINUE2; // this line is after
      // calculate area to erase:
      float r = (float)(X+W);
      float xx;
      if (p >= pp) {
	xx = (float)X;
	if (erase_cursor_only) r = xpos+2;
	else if (readonly()) xx -= 3;
      } else {
	xx = xpos + (float)expandpos(p, pp, buf, 0);
	if (erase_cursor_only) r = xx+2;
	else if (readonly()) xx -= 3;
      }
      // clip to and erase it:
      fl_push_clip((int)xx-1-height/8, Y+ypos, (int)(r-xx+2+height/4), height);
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
      // it now draws entire line over it
      // this should not draw letters to left of erased area, but
      // that is nyi.
    }

    // Draw selection area if required:
    if (selstart < selend && selstart <= e-value() && selend > p-value()) {
      const char* pp = value()+selstart;
      float x1 = xpos;
      int offset1 = 0;
      if (pp > p) {
	fl_color(tc);
	x1 += (float)expandpos(p, pp, buf, &offset1);
	fl_draw(buf, offset1, xpos, (float)(Y+ypos+desc));
      }
      pp = value()+selend;
      float x2 = (float)(X+W);
      int offset2;
      if (pp <= e) x2 = xpos + (float)expandpos(p, pp, buf, &offset2);
      else offset2 = (int) strlen(buf);
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text 
      if (Fl::compose_state) {
        fl_color(textcolor());
      }
      else 
#endif
      {
      fl_color(selection_color());
      fl_rectf((int)(x1+0.5), Y+ypos, (int)(x2-x1+0.5), height);
      fl_color(fl_contrast(textcolor(), selection_color()));
      }
      fl_draw(buf+offset1, offset2-offset1, x1, (float)(Y+ypos+desc));
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text
      if (Fl::compose_state) {
        fl_color( fl_color_average(textcolor(), color(), 0.6) );
        float width = fl_width(buf+offset1, offset2-offset1);
        fl_line(x1, Y+ypos+height-1, x1+width, Y+ypos+height-1);
      }
#endif
      if (pp < e) {
	fl_color(tc);
	fl_draw(buf+offset2, (int) strlen(buf+offset2), x2, (float)(Y+ypos+desc));
      }
    } else {
      // draw unselected text
      fl_color(tc);
      fl_draw(buf, (int) strlen(buf), xpos, (float)(Y+ypos+desc));
    }

    if (do_mu) fl_pop_clip();

  CONTINUE2:
    // draw the cursor:
    if (Fl::focus() == this && (
#ifdef __APPLE__
				Fl::compose_state || 
#endif
				selstart == selend) &&
	position() >= p-value() && position() <= e-value()) {
      fl_color(cursor_color());
      // cursor position may need to be recomputed (see STR #2486)
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (readonly()) {
        fl_line((int)(xpos+curx-2.5f), Y+ypos+height-1,
	        (int)(xpos+curx+0.5f), Y+ypos+height-4,
	        (int)(xpos+curx+3.5f), Y+ypos+height-1);
      } else {
        fl_rectf((int)(xpos+curx+0.5), Y+ypos, 2, height);
      }
#ifdef __APPLE__
      Fl::insertion_point_location(xpos+curx, Y+ypos+height, height);
#endif
    }

  CONTINUE:
    ypos += height;
    if (e >= value_+size_) break;
    if (*e == '\n' || *e == ' ') e++;
    p = e;
  }

  // for minimal update, erase all lines below last one if necessary:
  if (input_type()==FL_MULTILINE_INPUT && do_mu && ypos<H
      && (!erase_cursor_only || p <= value()+mu_p)) {
    if (ypos < 0) ypos = 0;
    fl_push_clip(X, Y+ypos, W, H-ypos);
    draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
             W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    fl_pop_clip();
  }

  fl_pop_clip();
  if (Fl::focus() == this) {
       fl_set_spot(textfont(), textsize(),
               (int)xpos+curx, Y+ypos-fl_descent(), W, H, window());
  }
}